

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<DomStringPropertySpecification*>::emplace<DomStringPropertySpecification*&>
          (QPodArrayOps<DomStringPropertySpecification_*> *this,qsizetype i,
          DomStringPropertySpecification **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  DomStringPropertySpecification **ppDVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<DomStringPropertySpecification_*> *in_RDI;
  DomStringPropertySpecification **where;
  GrowthPosition pos;
  DomStringPropertySpecification *tmp;
  bool detach;
  QArrayDataPointer<DomStringPropertySpecification_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  DomStringPropertySpecification *pDVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<DomStringPropertySpecification_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<DomStringPropertySpecification_*>::freeSpaceAtEnd
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppDVar3 = QArrayDataPointer<DomStringPropertySpecification_*>::end(in_RDI);
      *ppDVar3 = (DomStringPropertySpecification *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<DomStringPropertySpecification_*>::freeSpaceAtBegin
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppDVar3 = QArrayDataPointer<DomStringPropertySpecification_*>::begin
                          ((QArrayDataPointer<DomStringPropertySpecification_*> *)0x1e99a7);
      ppDVar3[-1] = (DomStringPropertySpecification *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pDVar5 = (DomStringPropertySpecification *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<DomStringPropertySpecification_*>::detachAndGrow
            ((QArrayDataPointer<DomStringPropertySpecification_*> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0),(GrowthPosition)((ulong)pDVar5 >> 0x20),
             CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (DomStringPropertySpecification ***)in_stack_ffffffffffffffc8,in_RDI);
  ppDVar3 = QPodArrayOps<DomStringPropertySpecification_*>::createHole
                      ((QPodArrayOps<DomStringPropertySpecification_*> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pDVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppDVar3 = pDVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }